

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

int strlen_html(SXML_CHAR *str)

{
  int local_24;
  int local_20;
  int n;
  int j;
  int i;
  SXML_CHAR *str_local;
  
  if (str == (SXML_CHAR *)0x0) {
    str_local._4_4_ = 0;
  }
  else {
    local_24 = 0;
    for (n = 0; str[n] != '\0'; n = n + 1) {
      local_20 = 0;
      while (HTML_SPECIAL_DICT[local_20].chr != '\0') {
        if (str[n] == HTML_SPECIAL_DICT[local_20].chr) {
          local_24 = HTML_SPECIAL_DICT[local_20].html_len + local_24;
          break;
        }
        local_20 = local_20 + 1;
      }
      if (HTML_SPECIAL_DICT[local_20].chr == '\0') {
        local_24 = local_24 + 1;
      }
    }
    str_local._4_4_ = local_24;
  }
  return str_local._4_4_;
}

Assistant:

int strlen_html(SXML_CHAR* str)
{
	int i, j, n;
	
	if (str == NULL)
		return 0;

	n = 0;
	for (i = 0; str[i] != NULC; i++) {
		for (j = 0; HTML_SPECIAL_DICT[j].chr; j++) {
			if (str[i] == HTML_SPECIAL_DICT[j].chr) {
				n += HTML_SPECIAL_DICT[j].html_len;
				break;
			}
		}
		if (HTML_SPECIAL_DICT[j].chr == NULC)
			n++;
	}

	return n;
}